

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_35081::Environment::RandomNewFree(Environment *this,BitGen *gen,size_t min_index)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  enable_if_t<absl::disjunction<std::is_same<IntervalClosedOpenTag,_IntervalClosedClosedTag>,_std::is_same<IntervalClosedOpenTag,_IntervalClosedOpenTag>_>::value,_unsigned_long>
  a_1;
  shared_ptr<const_upb::Arena> a;
  Arena *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  undefined8 local_30;
  size_t local_28;
  
  local_40 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<upb::Arena_const,std::allocator<upb::Arena>>
            (&local_38,&local_40,(allocator<upb::Arena> *)&local_28);
  local_30 = 100;
  local_28 = min_index;
  if (min_index < 100) {
    min_index = absl::lts_20250127::random_internal::
                DistributionCaller<absl::lts_20250127::random_internal::NonsecureURBGBase<absl::lts_20250127::random_internal::randen_engine<unsigned_long>,absl::lts_20250127::random_internal::RandenPoolSeedSeq>>
                ::
                Impl<absl::lts_20250127::random_internal::UniformDistributionWrapper<unsigned_long>,unsigned_long&,unsigned_long&>
                          (gen,&local_28,&local_30);
  }
  absl::lts_20250127::Mutex::Lock(&this->mutex_);
  peVar1 = (this->arenas_)._M_elems[min_index].
           super___shared_ptr<const_upb::Arena,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (this->arenas_)._M_elems[min_index].
  super___shared_ptr<const_upb::Arena,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_40;
  p_Var2 = (this->arenas_)._M_elems[min_index].
           super___shared_ptr<const_upb::Arena,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->arenas_)._M_elems[min_index].
  super___shared_ptr<const_upb::Arena,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_38._M_pi;
  local_40 = peVar1;
  local_38._M_pi = p_Var2;
  absl::lts_20250127::Mutex::Unlock(&this->mutex_);
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
  }
  return;
}

Assistant:

void RandomNewFree(absl::BitGen& gen, size_t min_index = 0) {
    auto a = std::make_shared<const upb::Arena>();
    SwapRandomArena(gen, a, min_index);
  }